

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<signed_char>(uint length)

{
  char cVar1;
  char cVar2;
  char *__p;
  element_type *pSrc;
  undefined8 *puVar3;
  int local_40;
  int i_1;
  int local_2c;
  int i;
  char *v;
  shared_ptr<signed_char> pv;
  uint length_local;
  
  pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = length;
  __p = sse::common::malloc<signed_char>(length);
  std::shared_ptr<signed_char>::shared_ptr<signed_char,void(*)(signed_char*),void>
            ((shared_ptr<signed_char> *)&v,__p,sse::common::free<signed_char>);
  pSrc = std::__shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_2c = 0;
      local_2c <
      (int)pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      local_2c = local_2c + 1) {
    pSrc[local_2c] = -(char)local_2c;
  }
  sse::arithmetic::abs<signed_char>
            (pSrc,pSrc,
             pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_)
  ;
  local_40 = 0;
  do {
    if ((int)pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
        <= local_40) {
      std::shared_ptr<signed_char>::~shared_ptr((shared_ptr<signed_char> *)&v);
      return;
    }
    if (pSrc[local_40] < '\0') {
      cVar1 = pSrc[local_40];
      cVar2 = std::numeric_limits<signed_char>::min();
      if (cVar1 != cVar2) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_abs(unsigned int) [T = signed char]";
        *(undefined4 *)(puVar3 + 1) = 0x81;
        *(uint *)((long)puVar3 + 0xc) =
             pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}